

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ublox.cpp
# Opt level: O3

int __thiscall Ublox::testConnection(Ublox *this)

{
  UBXScanner *pUVar1;
  int iVar2;
  int iVar3;
  uchar from_gps_data;
  uchar to_gps_data;
  uchar from_gps_data_nav [18888];
  uchar local_4a [26];
  uchar local_30 [16];
  
  local_4a[1] = 0;
  local_4a[0] = '\0';
  local_30[0] = 0xb5;
  local_30[1] = 'b';
  local_30[2] = '\x06';
  local_30[3] = '\x01';
  local_30[4] = '\x03';
  local_30[5] = '\0';
  local_30[6] = '\x01';
  local_30[7] = '\x02';
  local_30[8] = '\x01';
  local_30[9] = '\x0e';
  local_30[10] = 'G';
  iVar2 = SPIdev::transfer((this->spi_device_name)._M_dataplus._M_p,local_30,local_4a + 2,0xb,200000
                           ,'\b',0);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not configure ublox over SPI\n",0x23);
  }
  local_30[0] = 0xb5;
  local_30[1] = 'b';
  local_30[2] = '\x06';
  local_30[3] = '\x01';
  local_30[4] = '\x03';
  local_30[5] = '\0';
  local_30[6] = '\x01';
  local_30[7] = '\x03';
  local_30[8] = '\x01';
  local_30[9] = '\x0f';
  local_30[10] = 'I';
  iVar2 = SPIdev::transfer((this->spi_device_name)._M_dataplus._M_p,local_30,local_4a + 2,0xb,200000
                           ,'\b',0);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not configure ublox over SPI\n",0x23);
  }
  local_30[0] = 0xb5;
  local_30[1] = 'b';
  local_30[2] = '\x06';
  local_30[3] = '\x01';
  local_30[4] = '\x03';
  local_30[5] = '\0';
  local_30[6] = '\x01';
  local_30[7] = ' ';
  local_30[8] = '\x01';
  local_30[9] = ',';
  local_30[10] = 0x83;
  iVar2 = SPIdev::transfer((this->spi_device_name)._M_dataplus._M_p,local_30,local_4a + 2,0xb,200000
                           ,'\b',0);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not configure ublox over SPI\n",0x23);
  }
  iVar2 = 0x200;
  do {
    SPIdev::transfer((this->spi_device_name)._M_dataplus._M_p,local_4a + 1,local_4a,1,200000,'\b',0)
    ;
    iVar3 = UBXScanner::update(this->scanner,local_4a[0]);
    if (iVar3 == 9) {
      iVar3 = UBXParser::checkMessage(this->parser);
      pUVar1 = this->scanner;
      pUVar1->message_length = 0;
      pUVar1->position = 0;
      pUVar1->state = Sync1;
      if (iVar3 != 0) {
        return 1;
      }
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return 0;
}

Assistant:

int Ublox::testConnection()
{
    int status;
    int count = 0;
    unsigned char to_gps_data = 0x00, from_gps_data = 0x00;

    // we do this, so that at least one ubx message is enabled

    if (enableNAV_POSLLH()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_STATUS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_TIMEGPS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    while (count < UBX_BUFFER_LENGTH/2)
    {
        // From now on, we will send zeroes to the receiver, which it will ignore
        // However, we are simultaneously getting useful information from it
        SPIdev::transfer(spi_device_name.c_str(), &to_gps_data, &from_gps_data, 1, 200000);

        // Scanner checks the message structure with every byte received
        status = scanner->update(from_gps_data);

        if (status == UBXScanner::Done)
        {
            // Once we have a full message we decode it and reset the scanner, making it look for another message
            // in the data stream, coming over SPI

            // If we find at least one valid message in the buffer, we consider connection to be established
            if(parser->checkMessage()==1)
            {
                scanner->reset();
                return 1;
            }

            scanner->reset();
        }

        count++;
    }

    return 0;
}